

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goesproc.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  undefined1 uVar2;
  int __fd;
  ostream *poVar3;
  element_type *this;
  shared_ptr<FileWriter> *fileWriter_00;
  long lVar4;
  char ***in_stack_00000020;
  int *in_stack_00000028;
  LRITProcessor p_1;
  PacketProcessor *in_stack_00000130;
  bool verbose;
  unique_ptr<PacketReader,_std::default_delete<PacketReader>_> reader;
  PacketProcessor p;
  string *origin_1;
  string *origin;
  Handler *handler;
  iterator __end1;
  iterator __begin1;
  vector<Config::Handler,_std::allocator<Config::Handler>_> *__range1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  handlers;
  shared_ptr<FileWriter> fileWriter;
  Config config;
  Options opts;
  vector<Config::Handler,_std::allocator<Config::Handler>_> *in_stack_fffffffffffffca8;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *handlers_00;
  Options *in_stack_fffffffffffffcb0;
  Handler *in_stack_fffffffffffffcb8;
  NWSImageHandler *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffd08;
  string *in_stack_fffffffffffffd20;
  undefined7 in_stack_fffffffffffffd58;
  Himawari8ImageHandler *in_stack_fffffffffffffd60;
  shared_ptr<FileWriter> *in_stack_fffffffffffffd90;
  Handler *in_stack_fffffffffffffd98;
  GOESNImageHandler *this_00;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  local_258;
  shared_ptr<FileWriter> *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  GOESRImageHandler *in_stack_fffffffffffffde0;
  Options local_208;
  undefined1 local_178 [40];
  __normal_iterator<Config::Handler_*,_std::vector<Config::Handler,_std::allocator<Config::Handler>_>_>
  local_150;
  undefined1 *local_148;
  byte local_108;
  string local_100 [32];
  undefined1 auStack_e0 [80];
  undefined4 local_70;
  undefined1 local_6c;
  undefined8 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  _Base_ptr in_stack_ffffffffffffffc0;
  
  setenv("TZ","",1);
  this_00 = (GOESNImageHandler *)&stack0xffffffffffffff70;
  parseOptions(in_stack_00000028,in_stack_00000020);
  Config::load(in_stack_fffffffffffffd08);
  if ((local_108 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid configuration: ");
    poVar3 = std::operator<<(poVar3,local_100);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  util::mkdirp(in_stack_fffffffffffffd20);
  std::make_shared<FileWriter,std::__cxx11::string&>(in_stack_fffffffffffffcd8);
  if ((local_6c & 1) != 0) {
    this = std::__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<FileWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x26778e);
    FileWriter::setForce(this,true);
  }
  std::
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  ::vector((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
            *)0x2677c5);
  local_148 = auStack_e0;
  local_150._M_current =
       (Handler *)
       std::vector<Config::Handler,_std::allocator<Config::Handler>_>::begin
                 (in_stack_fffffffffffffca8);
  local_178._32_8_ =
       std::vector<Config::Handler,_std::allocator<Config::Handler>_>::end
                 (in_stack_fffffffffffffca8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Config::Handler_*,_std::vector<Config::Handler,_std::allocator<Config::Handler>_>_>
                        *)in_stack_fffffffffffffcb0,
                       (__normal_iterator<Config::Handler_*,_std::vector<Config::Handler,_std::allocator<Config::Handler>_>_>
                        *)in_stack_fffffffffffffca8);
    if (!bVar1) {
      if (local_70 == 1) {
        in_stack_fffffffffffffcb0 = &local_208;
        std::
        vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
        ::vector((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                  *)in_stack_fffffffffffffcb0,
                 (vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                  *)in_stack_fffffffffffffca8);
        PacketProcessor::PacketProcessor
                  ((PacketProcessor *)in_stack_fffffffffffffcc0,
                   (vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                    *)in_stack_fffffffffffffcb8);
        std::
        vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
        ::~vector((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                   *)in_stack_fffffffffffffcc0);
        std::unique_ptr<PacketReader,std::default_delete<PacketReader>>::
        unique_ptr<std::default_delete<PacketReader>,void>
                  ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)
                   in_stack_fffffffffffffcb0);
        lVar4 = std::__cxx11::string::size();
        if (lVar4 == 0) {
          std::
          make_unique<FileReader,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffcc8);
          std::unique_ptr<PacketReader,std::default_delete<PacketReader>>::operator=
                    ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)
                     in_stack_fffffffffffffcc0,
                     (unique_ptr<FileReader,_std::default_delete<FileReader>_> *)
                     in_stack_fffffffffffffcb8);
          std::unique_ptr<FileReader,_std::default_delete<FileReader>_>::~unique_ptr
                    ((unique_ptr<FileReader,_std::default_delete<FileReader>_> *)
                     in_stack_fffffffffffffcb0);
        }
        else {
          std::make_unique<NanomsgReader,std::__cxx11::string&>(in_stack_fffffffffffffcc8);
          std::unique_ptr<PacketReader,std::default_delete<PacketReader>>::operator=
                    ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)
                     in_stack_fffffffffffffcc0,
                     (unique_ptr<NanomsgReader,_std::default_delete<NanomsgReader>_> *)
                     in_stack_fffffffffffffcb8);
          std::unique_ptr<NanomsgReader,_std::default_delete<NanomsgReader>_>::~unique_ptr
                    ((unique_ptr<NanomsgReader,_std::default_delete<NanomsgReader>_> *)
                     in_stack_fffffffffffffcb0);
        }
        __fd = fileno(_stdout);
        isatty(__fd);
        PacketProcessor::run
                  (in_stack_00000130,
                   (unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)
                   p_1.handlers_.
                   super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   p_1.handlers_.
                   super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._7_1_);
        std::unique_ptr<PacketReader,_std::default_delete<PacketReader>_>::~unique_ptr
                  ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)
                   in_stack_fffffffffffffcc0);
        PacketProcessor::~PacketProcessor((PacketProcessor *)in_stack_fffffffffffffcb0);
      }
      if (local_70 == 2) {
        handlers_00 = &local_258;
        std::
        vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
        ::vector((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                  *)in_stack_fffffffffffffcb0,handlers_00);
        LRITProcessor::LRITProcessor((LRITProcessor *)in_stack_fffffffffffffcb0,handlers_00);
        std::
        vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
        ::~vector((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                   *)in_stack_fffffffffffffcc0);
        LRITProcessor::run((LRITProcessor *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                           (char **)in_stack_ffffffffffffffb0);
        LRITProcessor::~LRITProcessor((LRITProcessor *)0x26833e);
      }
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::~vector((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                 *)in_stack_fffffffffffffcc0);
      std::shared_ptr<FileWriter>::~shared_ptr((shared_ptr<FileWriter> *)0x2683a0);
      Config::~Config((Config *)in_stack_fffffffffffffcb0);
      Options::~Options(in_stack_fffffffffffffcb0);
      return 0;
    }
    local_178._24_8_ =
         __gnu_cxx::
         __normal_iterator<Config::Handler_*,_std::vector<Config::Handler,_std::allocator<Config::Handler>_>_>
         ::operator*(&local_150);
    bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,(char *)in_stack_fffffffffffffca8);
    if (bVar1) {
      local_178._16_8_ = local_178._24_8_ + 0x20;
      bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,(char *)in_stack_fffffffffffffca8);
      if ((((bVar1) ||
           (bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,
                                    (char *)in_stack_fffffffffffffca8), bVar1)) ||
          (bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,
                                   (char *)in_stack_fffffffffffffca8), bVar1)) ||
         (bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,
                                  (char *)in_stack_fffffffffffffca8), bVar1)) {
        operator_new(0x290);
        GOESRImageHandler::GOESRImageHandler
                  (in_stack_fffffffffffffde0,
                   (Handler *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                   in_stack_fffffffffffffdd0);
        std::unique_ptr<Handler,std::default_delete<Handler>>::
        unique_ptr<std::default_delete<Handler>,void>
                  ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffcb0,
                   (pointer)in_stack_fffffffffffffca8);
        std::
        vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
        ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                     *)in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
        std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
                  ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffcb0);
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,(char *)in_stack_fffffffffffffca8
                               );
        if (bVar1) {
          operator_new(0x1f8);
          NWSImageHandler::NWSImageHandler
                    (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     (shared_ptr<FileWriter> *)in_stack_fffffffffffffcb0);
          in_stack_fffffffffffffd60 = (Himawari8ImageHandler *)local_178;
          std::unique_ptr<Handler,std::default_delete<Handler>>::
          unique_ptr<std::default_delete<Handler>,void>
                    ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffcb0
                     ,(pointer)in_stack_fffffffffffffca8);
          std::
          vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
          ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                       *)in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
          std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
                    ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffcb0
                    );
        }
        else {
          uVar2 = std::operator==(&in_stack_fffffffffffffcb0->config,
                                  (char *)in_stack_fffffffffffffca8);
          if ((bool)uVar2) {
            fileWriter_00 = (shared_ptr<FileWriter> *)operator_new(0x250);
            Himawari8ImageHandler::Himawari8ImageHandler
                      (in_stack_fffffffffffffd60,
                       (Handler *)CONCAT17(uVar2,in_stack_fffffffffffffd58),fileWriter_00);
            std::unique_ptr<Handler,std::default_delete<Handler>>::
            unique_ptr<std::default_delete<Handler>,void>
                      ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                       in_stack_fffffffffffffcb0,(pointer)in_stack_fffffffffffffca8);
            std::
            vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
            ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                         *)in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
            std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
                      ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                       in_stack_fffffffffffffcb0);
          }
          else {
            bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,
                                    (char *)in_stack_fffffffffffffca8);
            if ((!bVar1) &&
               (bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,
                                        (char *)in_stack_fffffffffffffca8), !bVar1)) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid image handler origin: ");
              poVar3 = std::operator<<(poVar3,(string *)(local_178._24_8_ + 0x20));
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              exit(1);
            }
            operator_new(600);
            GOESNImageHandler::GOESNImageHandler
                      (this_00,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
            std::unique_ptr<Handler,std::default_delete<Handler>>::
            unique_ptr<std::default_delete<Handler>,void>
                      ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                       in_stack_fffffffffffffcb0,(pointer)in_stack_fffffffffffffca8);
            std::
            vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
            ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                         *)in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
            std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
                      ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                       in_stack_fffffffffffffcb0);
          }
        }
      }
    }
    else {
      bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,(char *)in_stack_fffffffffffffca8);
      if (bVar1) {
        operator_new(0x1f8);
        EMWINHandler::EMWINHandler
                  ((EMWINHandler *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                   (shared_ptr<FileWriter> *)in_stack_fffffffffffffcb0);
        std::unique_ptr<Handler,std::default_delete<Handler>>::
        unique_ptr<std::default_delete<Handler>,void>
                  ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffcb0,
                   (pointer)in_stack_fffffffffffffca8);
        std::
        vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
        ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                     *)in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
        std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
                  ((unique_ptr<Handler,_std::default_delete<Handler>_> *)in_stack_fffffffffffffcb0);
      }
      else {
        bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,(char *)in_stack_fffffffffffffca8
                               );
        if (!bVar1) {
          bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,
                                  (char *)in_stack_fffffffffffffca8);
          if (!bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid handler type: ");
            poVar3 = std::operator<<(poVar3,(string *)local_178._24_8_);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            exit(1);
          }
          local_208.paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_178._24_8_ + 0x20);
          bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,
                                  (char *)in_stack_fffffffffffffca8);
          if (bVar1) {
            operator_new(0x1f8);
            NWSTextHandler::NWSTextHandler
                      ((NWSTextHandler *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                       (shared_ptr<FileWriter> *)in_stack_fffffffffffffcb0);
            std::unique_ptr<Handler,std::default_delete<Handler>>::
            unique_ptr<std::default_delete<Handler>,void>
                      ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                       in_stack_fffffffffffffcb0,(pointer)in_stack_fffffffffffffca8);
            std::
            vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
            ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                         *)in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
            std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
                      ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                       in_stack_fffffffffffffcb0);
          }
          else {
            bVar1 = std::operator==(&in_stack_fffffffffffffcb0->config,
                                    (char *)in_stack_fffffffffffffca8);
            if (!bVar1) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"Invalid text handler product: ");
              poVar3 = std::operator<<(poVar3,(string *)(local_178._24_8_ + 0x20));
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              exit(1);
            }
            operator_new(0x1f8);
            TextHandler::TextHandler
                      ((TextHandler *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                       (shared_ptr<FileWriter> *)in_stack_fffffffffffffcb0);
            std::unique_ptr<Handler,std::default_delete<Handler>>::
            unique_ptr<std::default_delete<Handler>,void>
                      ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                       in_stack_fffffffffffffcb0,(pointer)in_stack_fffffffffffffca8);
            std::
            vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
            ::push_back((vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                         *)in_stack_fffffffffffffcb0,(value_type *)in_stack_fffffffffffffca8);
            std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
                      ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                       in_stack_fffffffffffffcb0);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<Config::Handler_*,_std::vector<Config::Handler,_std::allocator<Config::Handler>_>_>
    ::operator++(&local_150);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Dealing with time zones is a PITA even if you only care about UTC.
  // Since this is not a library we can get away with the following...
  setenv("TZ", "", 1);

  auto opts = parseOptions(argc, argv);
  auto config = Config::load(opts.config);
  if (!config.ok) {
    std::cerr << "Invalid configuration: " << config.error << std::endl;
    exit(1);
  }

  // Make sure output directory exists
  mkdirp(opts.out);

  // Handlers share a file writer instance
  auto fileWriter = std::make_shared<FileWriter>(opts.out);
  if (opts.force) {
    fileWriter->setForce(true);
  }

  // Construct list of file handlers
  std::vector<std::unique_ptr<Handler> > handlers;
  for (const auto& handler: config.handlers) {
    if (handler.type == "image") {
      const auto& origin = handler.origin;
      if (origin == "goes16" || origin == "goes17" || origin == "goes18" || origin == "goes19") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new GOESRImageHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "nws") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new NWSImageHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "himawari8") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new Himawari8ImageHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "goes13" || origin == "goes15") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new GOESNImageHandler(handler, fileWriter)));
        continue;
      }

      std::cerr << "Invalid image handler origin: " << handler.origin << std::endl;
      exit(1);
    } else if (handler.type == "emwin") {
      handlers.push_back(
        std::unique_ptr<Handler>(
          new EMWINHandler(handler, fileWriter)));
    } else if (handler.type == "dcs") {
      // TODO
    } else if (handler.type == "text") {
      const auto& origin = handler.origin;
      if (origin == "nws") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new NWSTextHandler(handler, fileWriter)));
        continue;
      }

      if (origin == "other") {
        handlers.push_back(
          std::unique_ptr<Handler>(
            new TextHandler(handler, fileWriter)));
        continue;
      }

      std::cerr << "Invalid text handler product: " << handler.origin << std::endl;
      exit(1);
    } else {
      std::cerr << "Invalid handler type: " << handler.type << std::endl;
      exit(1);
    }
  }

  if (opts.mode == ProcessMode::PACKET) {
    PacketProcessor p(std::move(handlers));
    std::unique_ptr<PacketReader> reader;

    // Either use subscriber or read packets from files
    if (opts.subscribe.size() > 0) {
      reader = std::make_unique<NanomsgReader>(opts.subscribe);
    } else {
      reader = std::make_unique<FileReader>(opts.paths);
    }

    // Run in verbose mode when stdout is a TTY.
    bool verbose = isatty(fileno(stdout));
    p.run(reader, verbose);
  }

  if (opts.mode == ProcessMode::LRIT) {
    LRITProcessor p(std::move(handlers));
    p.run(argc, argv);
  }
}